

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIBuildOnlyReporter.cpp
# Opt level: O3

bool __thiscall
ApprovalTests::CIBuildOnlyReporter::report
          (CIBuildOnlyReporter *this,string *received,string *approved)

{
  element_type *peVar1;
  pointer pcVar2;
  bool bVar3;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  bVar3 = isRunningUnderCI();
  if (bVar3) {
    peVar1 = (this->m_reporter).
             super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar2 = (received->_M_dataplus)._M_p;
    local_48[0] = local_38;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar2,pcVar2 + received->_M_string_length);
    pcVar2 = (approved->_M_dataplus)._M_p;
    local_68[0] = local_58;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,pcVar2,pcVar2 + approved->_M_string_length);
    (*peVar1->_vptr_Reporter[2])(peVar1,local_48,local_68);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  return bVar3;
}

Assistant:

bool CIBuildOnlyReporter::report(std::string received, std::string approved) const
    {
        if (!isRunningUnderCI())
        {
            return false;
        }
        m_reporter->report(received, approved);
        // Return true regardless of whether our report succeeded or not,
        // so that no later reporters run.
        return true;
    }